

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  ConfigString *pCVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsOut;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  PolicyStatus PVar10;
  uint uVar11;
  string *psVar12;
  cmState *pcVar13;
  cmValue cVar14;
  string *psVar15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  uint uVar16;
  char *extraout_RDX;
  char *extraout_RDX_00;
  unsigned_long val;
  long lVar17;
  long lVar18;
  string *depName;
  SystemInformationImplementation *pSVar19;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  string_view arg;
  string_view value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  string_view arg_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  string_view arg_01;
  string_view arg_02;
  string_view suffix;
  string_view suffix_00;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string def;
  unsigned_long iVerb;
  string cbd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filterList;
  string relativeBuildDir;
  undefined1 local_118 [24];
  char *pcStack_100;
  size_type local_f8;
  pointer local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 local_40;
  char *pcStack_38;
  
  iVar9 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x26])();
  this->MultiConfig = SUB41(iVar9,0);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_((string *)local_118,this->Makefile);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)local_118);
  pSVar19 = (SystemInformationImplementation *)(local_118 + 0x10);
  if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8,this->Makefile,IncludeEmptyConfig);
  local_118._16_8_ =
       (this->ConfigsList).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._M_dataplus._M_p;
  local_118._0_8_ =
       (this->ConfigsList).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_118._8_8_ =
       (this->ConfigsList).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  pcVar2 = this->Makefile;
  local_d8._0_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_AUTOGEN_VERBOSE","");
  psVar12 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_d8);
  pcVar3 = (psVar12->_M_dataplus)._M_p;
  local_118._0_8_ = pSVar19;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,pcVar3,pcVar3 + psVar12->_M_string_length);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
      &local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
  }
  if ((pointer)local_118._8_8_ != (pointer)0x0) {
    local_d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar7 = cmStrToULong((string *)local_118,(unsigned_long *)local_d8);
    if (bVar7) {
      uVar16 = local_d8._0_4_;
    }
    else {
      value._M_str = extraout_RDX;
      value._M_len = local_118._0_8_;
      bVar7 = cmValue::IsOn((cmValue *)local_118._8_8_,value);
      uVar16 = 1;
      if (!bVar7) goto LAB_00241e66;
    }
    this->Verbosity = uVar16;
  }
LAB_00241e66:
  if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  pcVar13 = cmMakefile::GetState(this->Makefile);
  local_118._0_8_ = pSVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"AUTOMOC_TARGETS_FOLDER","");
  cVar14 = cmState::GetGlobalProperty(pcVar13,(string *)local_118);
  if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  if (cVar14.Value == (string *)0x0) {
    pcVar13 = cmMakefile::GetState(this->Makefile);
    local_118._0_8_ = pSVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"AUTOGEN_TARGETS_FOLDER","")
    ;
    cVar14 = cmState::GetGlobalProperty(pcVar13,(string *)local_118);
    if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if (cVar14.Value != (string *)0x0) goto LAB_00241f72;
    pcVar4 = this->GenTarget;
    local_118._0_8_ = pSVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"FOLDER","");
    cVar14 = cmGeneratorTarget::GetProperty(pcVar4,(string *)local_118);
    if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if (cVar14.Value != (string *)0x0) goto LAB_00241f72;
  }
  else {
LAB_00241f72:
    std::__cxx11::string::_M_assign((string *)&this->TargetsFolder);
  }
  PVar10 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0071,false);
  if (PVar10 - NEW < 3) {
    this->CMP0071Accept = true;
  }
  else if (PVar10 == WARN) {
    this->CMP0071Warn = true;
  }
  PVar10 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0100,false);
  if (PVar10 - NEW < 3) {
    this->CMP0100Accept = true;
  }
  else if (PVar10 == WARN) {
    this->CMP0100Warn = true;
  }
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_118._8_8_ = (pointer)0x0;
  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
  local_118._0_8_ = pSVar19;
  psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)&local_a8,(string *)local_118,psVar12);
  if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  uVar6 = local_a8._8_8_;
  uVar5 = local_a8._M_allocated_capacity;
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  local_118._0_8_ = uVar6;
  local_118._8_8_ = uVar5;
  local_118._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  pcStack_100 = (char *)((long)"**/CMakeFiles/" + 2);
  local_f0 = (psVar12->_M_dataplus)._M_p;
  local_f8 = psVar12->_M_string_length;
  local_e8 = 0xc;
  local_e0 = "_autogen.dir";
  views._M_len = 4;
  views._M_array = (iterator)local_118;
  cmCatViews_abi_cxx11_((string *)local_d8,views);
  std::__cxx11::string::operator=((string *)&this->Dir,(string *)local_d8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
      &local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Info);
  pcVar4 = this->GenTarget;
  local_118._0_8_ = pSVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"AUTOGEN_BUILD_DIR","");
  cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_118);
  psVar12 = &(this->Dir).Build;
  std::__cxx11::string::_M_assign((string *)psVar12);
  if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  uVar5 = local_a8._M_allocated_capacity;
  if ((this->Dir).Build._M_string_length == 0) {
    local_d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    local_c8._M_dataplus._M_p._0_1_ = 0x2f;
    local_d8._8_8_ = &local_c8;
    psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    local_118._0_8_ = local_a8._8_8_;
    local_118._8_8_ = uVar5;
    local_118._16_8_ = local_d8._0_8_;
    pcStack_100 = (char *)local_d8._8_8_;
    local_f0 = (psVar15->_M_dataplus)._M_p;
    local_f8 = psVar15->_M_string_length;
    local_e8 = 8;
    local_e0 = "_autogen";
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_118;
    cmCatViews_abi_cxx11_((string *)&local_88,views_00);
    std::__cxx11::string::operator=((string *)psVar12,(string *)local_88._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity != &local_78) {
      operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::ConvertToUnixSlashes(psVar12);
  cmSystemTools::RelativePath((string *)local_118,(string *)&local_a8,psVar12);
  std::__cxx11::string::operator=((string *)&(this->Dir).RelativeBuild,(string *)local_118);
  if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  AddCleanFile(this,psVar12);
  psVar12 = &(this->Dir).Work;
  std::__cxx11::string::_M_assign((string *)psVar12);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar12);
  local_118._8_8_ = (this->Dir).Build._M_dataplus._M_p;
  local_118._0_8_ = (this->Dir).Build._M_string_length;
  local_118._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  pcStack_100 = (char *)((long)"/usr/include" + 4);
  views_01._M_len = 2;
  views_01._M_array = (iterator)local_118;
  cmCatViews_abi_cxx11_((string *)local_d8,views_01);
  psVar12 = &(this->Dir).IncludeGenExp;
  local_40 = 0;
  pcStack_38 = "";
  prefix_01._M_str = (char *)local_d8._0_8_;
  prefix_01._M_len = local_d8._8_8_;
  ConfigFileNamesAndGenex
            (this,&(this->Dir).Include,psVar12,prefix_01,(string_view)(ZEXT816(0x744109) << 0x40));
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
      &local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity,local_98._M_allocated_capacity + 1);
  }
  bVar7 = (this->Moc).super_GenVarsT.Enabled;
  bVar8 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar7 | bVar8) & 1) == 0) goto LAB_00242a51;
  if (bVar7 == false) {
LAB_00242348:
    if (((bVar8 & 1) == 0) || (bVar7 = InitUic(this), bVar7)) {
      psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_118._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_118._0_8_ = psVar15->_M_string_length;
      local_118._16_8_ = 8;
      pcStack_100 = (char *)((long)"cmake_autogen" + 5);
      views_02._M_len = 2;
      views_02._M_array = (iterator)local_118;
      cmCatViews_abi_cxx11_((string *)local_d8,views_02);
      std::__cxx11::string::operator=((string *)&this->AutogenTarget,(string *)local_d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
          &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
      }
      pcVar4 = this->GenTarget;
      local_118._0_8_ = pSVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"AUTOGEN_PARALLEL","");
      psVar15 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_118);
      if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if (psVar15->_M_string_length == 0) {
LAB_00242428:
        uVar16 = (anonymous_namespace)::GetParallelCPUCount()::count;
        if ((anonymous_namespace)::GetParallelCPUCount()::count == 0) {
          cmsys::SystemInformation::SystemInformation((SystemInformation *)local_118);
          cmsys::SystemInformation::RunCPUCheck((SystemInformation *)local_118);
          uVar11 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)local_118);
          uVar16 = 0x40;
          if (uVar11 < 0x41) {
            uVar16 = uVar11;
          }
          (anonymous_namespace)::GetParallelCPUCount()::count = 1;
          if (uVar11 != 0) {
            (anonymous_namespace)::GetParallelCPUCount()::count = uVar16;
          }
          cmsys::SystemInformation::~SystemInformation((SystemInformation *)local_118);
          uVar16 = (anonymous_namespace)::GetParallelCPUCount()::count;
        }
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)psVar15);
        uVar16 = 1;
        if (iVar9 == 0) goto LAB_00242428;
      }
      (this->AutogenTarget).Parallel = uVar16;
      local_118._8_8_ = (this->Dir).Info._M_dataplus._M_p;
      local_118._0_8_ = (this->Dir).Info._M_string_length;
      local_118._16_8_ = 0x11;
      pcStack_100 = "/AutogenInfo.json";
      views_03._M_len = 2;
      views_03._M_array = (iterator)local_118;
      cmCatViews_abi_cxx11_((string *)local_d8,views_03);
      std::__cxx11::string::operator=((string *)&(this->AutogenTarget).InfoFile,(string *)local_d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
          &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
      }
      local_118._8_8_ = (this->Dir).Info._M_dataplus._M_p;
      local_118._0_8_ = (this->Dir).Info._M_string_length;
      local_118._16_8_ = 0xc;
      pcStack_100 = "/AutogenUsed";
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_118;
      cmCatViews_abi_cxx11_((string *)local_d8,views_04);
      pCVar1 = &(this->AutogenTarget).SettingsFile;
      suffix._M_str = ".txt";
      suffix._M_len = 4;
      prefix._M_str = (char *)local_d8._0_8_;
      prefix._M_len = local_d8._8_8_;
      ConfigFileNames(this,pCVar1,prefix,suffix);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
          &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
      }
      ConfigFileClean(this,pCVar1);
      local_118._8_8_ = (this->Dir).Info._M_dataplus._M_p;
      local_118._0_8_ = (this->Dir).Info._M_string_length;
      local_118._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb;
      pcStack_100 = "/ParseCache";
      views_05._M_len = 2;
      views_05._M_array = (iterator)local_118;
      cmCatViews_abi_cxx11_((string *)local_d8,views_05);
      pCVar1 = &(this->AutogenTarget).ParseCacheFile;
      suffix_00._M_str = ".txt";
      suffix_00._M_len = 4;
      prefix_00._M_str = (char *)local_d8._0_8_;
      prefix_00._M_len = local_d8._8_8_;
      ConfigFileNames(this,pCVar1,prefix_00,suffix_00);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
          &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
      }
      ConfigFileClean(this,pCVar1);
      pcVar4 = this->GenTarget;
      local_118._0_8_ = pSVar19;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"AUTOGEN_ORIGIN_DEPENDS","");
      bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_118);
      (this->AutogenTarget).DependOrigin = bVar7;
      if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
      }
      pcVar4 = this->GenTarget;
      local_118._0_8_ = pSVar19;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"AUTOGEN_TARGET_DEPENDS","");
      psVar15 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_118);
      if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
      }
      local_68 = psVar12;
      if (psVar15->_M_string_length != 0) {
        arg._M_str = (psVar15->_M_dataplus)._M_p;
        arg._M_len = psVar15->_M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_118,arg,false);
        uVar5 = local_118._8_8_;
        if (local_118._0_8_ != local_118._8_8_) {
          pSVar19 = (SystemInformationImplementation *)local_118._0_8_;
          do {
            local_d8._0_8_ = cmMakefile::FindTargetToUse(this->Makefile,(string *)pSVar19,false);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(this->AutogenTarget).DependFiles,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pSVar19);
            }
            else {
              std::
              _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
              ::_M_insert_unique<cmTarget*const&>
                        ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                          *)&(this->AutogenTarget).DependTargets,(cmTarget **)local_d8);
            }
            pSVar19 = (SystemInformationImplementation *)&(pSVar19->Features).L3CacheSize;
          } while (pSVar19 != (SystemInformationImplementation *)uVar5);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_118);
      }
      pSVar19 = (SystemInformationImplementation *)(local_118 + 0x10);
      psVar12 = local_68;
      if ((this->Moc).super_GenVarsT.Enabled == true) {
        pcVar4 = this->GenTarget;
        local_118._0_8_ = pSVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"AUTOMOC_PATH_PREFIX","");
        cVar14 = cmGeneratorTarget::GetProperty(pcVar4,(string *)local_118);
        if (cVar14.Value == (string *)0x0) {
          bVar7 = false;
        }
        else {
          value_00._M_str = extraout_RDX_00;
          value_00._M_len = (size_t)((cVar14.Value)->_M_dataplus)._M_p;
          bVar7 = cmValue::IsOn((cmValue *)(cVar14.Value)->_M_string_length,value_00);
        }
        if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        if (bVar7 != false) {
          (this->Moc).PathPrefix = true;
        }
        pcVar2 = this->Makefile;
        local_118._0_8_ = pSVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"CMAKE_AUTOMOC_RELAXED_MODE","");
        bVar7 = cmMakefile::IsOn(pcVar2,(string *)local_118);
        if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        if (bVar7) {
          (this->Moc).RelaxedMode = true;
          pcVar2 = this->Makefile;
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
          pcStack_100 = (psVar12->_M_dataplus)._M_p;
          local_118._16_8_ = psVar12->_M_string_length;
          local_118._0_8_ = (SystemInformationImplementation *)0x85;
          local_118._8_8_ =
               "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  Consider disabling it and converting the target "
          ;
          local_f8 = 0x11;
          local_f0 = " to regular mode.";
          views_06._M_len = 3;
          views_06._M_array = (iterator)local_118;
          cmCatViews_abi_cxx11_((string *)local_d8,views_06);
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_d8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
              &local_c8) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_dataplus._M_p + 1));
          }
        }
        pcVar4 = this->GenTarget;
        local_118._0_8_ = pSVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"AUTOMOC_MOC_OPTIONS","");
        psVar12 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_118);
        arg_01._M_str = (psVar12->_M_dataplus)._M_p;
        arg_01._M_len = psVar12->_M_string_length;
        cmExpandList(arg_01,&(this->Moc).Options,false);
        if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        pcVar4 = this->GenTarget;
        local_118._0_8_ = pSVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"AUTOMOC_MACRO_NAMES","");
        psVar12 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_118);
        argsOut = &(this->Moc).MacroNames;
        arg_02._M_str = (psVar12->_M_dataplus)._M_p;
        arg_02._M_len = psVar12->_M_string_length;
        cmExpandList(arg_02,argsOut,false);
        if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        __first = cmRemoveDuplicates<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((this->Moc).MacroNames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->Moc).MacroNames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(argsOut,(iterator)__first._M_current,
                   (this->Moc).MacroNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        pcVar4 = this->GenTarget;
        local_118._0_8_ = pSVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"AUTOMOC_DEPEND_FILTERS","");
        psVar12 = cmGeneratorTarget::GetSafeProperty(pcVar4,(string *)local_118);
        arg_00._M_str = (psVar12->_M_dataplus)._M_p;
        arg_00._M_len = psVar12->_M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,arg_00,false);
        if ((SystemInformationImplementation *)local_118._0_8_ != pSVar19) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        val = (long)(local_88._8_8_ - local_88._0_8_) >> 5;
        if ((local_88._8_8_ - local_88._0_8_ & 0x20) != 0) {
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_d8,val);
          local_118._0_8_ = (SystemInformationImplementation *)0x2d;
          local_118._8_8_ = "AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ";
          local_118._16_8_ = local_d8._0_8_;
          pcStack_100 = (char *)local_d8._8_8_;
          local_f8 = 0x18;
          local_f0 = " is not a multiple of 2.";
          views_07._M_len = 3;
          views_07._M_array = (iterator)local_118;
          cmCatViews_abi_cxx11_((string *)&local_a8,views_07);
          cmSystemTools::Error((string *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_allocated_capacity != &local_98) {
            operator_delete((void *)local_a8._M_allocated_capacity,
                            local_98._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88);
          goto LAB_00242b74;
        }
        this_00 = &(this->Moc).DependFilters;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(this_00,(val >> 1) + 1);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[18],char_const(&)[57]>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)this_00,(char (*) [18])"Q_PLUGIN_METADATA",
                   (char (*) [57])
                   "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\([^\\)]*FILE[ \t]*\"([^\"]+)\"");
        if (local_88._8_8_ != local_88._M_allocated_capacity) {
          lVar18 = 0x20;
          lVar17 = 0;
          do {
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::__cxx11::string&,std::__cxx11::string&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((char *)(local_88._M_allocated_capacity + lVar18) + -0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_88._M_allocated_capacity + lVar18));
            lVar17 = lVar17 + 2;
            lVar18 = lVar18 + 0x40;
          } while (lVar17 != (long)(local_88._8_8_ - local_88._0_8_) >> 5);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
        psVar12 = local_68;
      }
LAB_00242a51:
      if (((this->Rcc).super_GenVarsT.Enabled != true) || (bVar7 = InitRcc(this), bVar7)) {
        if ((((this->Moc).super_GenVarsT.Enabled != false) ||
            (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) ||
           (((this->Rcc).super_GenVarsT.Enabled == true && (this->MultiConfig == true)))) {
          cmGeneratorTarget::AddIncludeDirectory(this->GenTarget,psVar12,true);
        }
        bVar7 = InitScanFiles(this);
        if (bVar7) {
          if (((this->Moc).super_GenVarsT.Enabled != false) ||
             (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
            InitAutogenTarget(this);
          }
          bVar7 = true;
          if ((this->Rcc).super_GenVarsT.Enabled == true) {
            InitRccTargets(this);
          }
          goto LAB_00242b76;
        }
      }
    }
  }
  else {
    bVar7 = InitMoc(this);
    if (bVar7) {
      bVar8 = (this->Uic).super_GenVarsT.Enabled;
      goto LAB_00242348;
    }
  }
LAB_00242b74:
  bVar7 = false;
LAB_00242b76:
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return bVar7;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  // Configurations
  this->MultiConfig = this->GlobalGen->IsMultiConfig();
  this->ConfigDefault = this->Makefile->GetDefaultConfiguration();
  this->ConfigsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Verbosity
  {
    std::string def =
      this->Makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
    if (!def.empty()) {
      unsigned long iVerb = 0;
      if (cmStrToULong(def, &iVerb)) {
        // Numeric verbosity
        this->Verbosity = static_cast<unsigned int>(iVerb);
      } else {
        // Non numeric verbosity
        if (cmIsOn(def)) {
          this->Verbosity = 1;
        }
      }
    }
  }

  // Targets FOLDER
  {
    cmValue folder =
      this->Makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!folder) {
      folder = this->Makefile->GetState()->GetGlobalProperty(
        "AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (!folder) {
      folder = this->GenTarget->GetProperty("FOLDER");
    }
    if (folder) {
      this->TargetsFolder = *folder;
    }
  }

  // Check status of policy CMP0071 regarding handling of GENERATED files
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0071)) {
    case cmPolicies::WARN:
      // Ignore GENERATED files but warn
      this->CMP0071Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore GENERATED files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process GENERATED files
      this->CMP0071Accept = true;
      break;
  }

  // Check status of policy CMP0100 regarding handling of .hh headers
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0100)) {
    case cmPolicies::WARN:
      // Ignore but .hh files but warn
      this->CMP0100Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore .hh files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process .hh file
      this->CMP0100Accept = true;
      break;
  }

  // Common directories
  std::string relativeBuildDir;
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), this->Makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cmStrCat(cbd, "/CMakeFiles/", this->GenTarget->GetName(),
                              "_autogen.dir");
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->GenTarget->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build =
        cmStrCat(cbd, '/', this->GenTarget->GetName(), "_autogen");
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    this->Dir.RelativeBuild =
      cmSystemTools::RelativePath(cbd, this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->ConfigFileNamesAndGenex(this->Dir.Include, this->Dir.IncludeGenExp,
                                  cmStrCat(this->Dir.Build, "/include"), "");
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !this->InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !this->InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name =
      cmStrCat(this->GenTarget->GetName(), "_autogen");

    // Autogen target parallel processing
    {
      std::string const& prop =
        this->GenTarget->GetSafeProperty("AUTOGEN_PARALLEL");
      if (prop.empty() || (prop == "AUTO")) {
        // Autodetect number of CPUs
        this->AutogenTarget.Parallel = GetParallelCPUCount();
      } else {
        this->AutogenTarget.Parallel = 1;
      }
    }

    // Autogen target info and settings files
    {
      // Info file
      this->AutogenTarget.InfoFile =
        cmStrCat(this->Dir.Info, "/AutogenInfo.json");

      // Used settings file
      this->ConfigFileNames(this->AutogenTarget.SettingsFile,
                            cmStrCat(this->Dir.Info, "/AutogenUsed"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.SettingsFile);

      // Parse cache file
      this->ConfigFileNames(this->AutogenTarget.ParseCacheFile,
                            cmStrCat(this->Dir.Info, "/ParseCache"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->GenTarget->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const& deps =
        this->GenTarget->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        for (std::string const& depName : cmExpandedList(deps)) {
          // Allow target and file dependencies
          auto* depTarget = this->Makefile->FindTargetToUse(depName);
          if (depTarget) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    if (this->Moc.Enabled) {
      // Path prefix
      if (cmIsOn(this->GenTarget->GetProperty("AUTOMOC_PATH_PREFIX"))) {
        this->Moc.PathPrefix = true;
      }

      // CMAKE_AUTOMOC_RELAXED_MODE
      if (this->Makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE")) {
        this->Moc.RelaxedMode = true;
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                   "deprecated an will be removed in the future.  Consider "
                   "disabling it and converting the target ",
                   this->GenTarget->GetName(), " to regular mode."));
      }

      // Options
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MOC_OPTIONS"),
                   this->Moc.Options);
      // Filters
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MACRO_NAMES"),
                   this->Moc.MacroNames);
      this->Moc.MacroNames.erase(cmRemoveDuplicates(this->Moc.MacroNames),
                                 this->Moc.MacroNames.end());
      {
        auto filterList = cmExpandedList(
          this->GenTarget->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
        if ((filterList.size() % 2) != 0) {
          cmSystemTools::Error(
            cmStrCat("AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ",
                     filterList.size(), " is not a multiple of 2."));
          return false;
        }
        this->Moc.DependFilters.reserve(1 + (filterList.size() / 2));
        this->Moc.DependFilters.emplace_back(
          "Q_PLUGIN_METADATA",
          "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\("
          "[^\\)]*FILE[ \t]*\"([^\"]+)\"");
        for (std::size_t ii = 0; ii != filterList.size(); ii += 2) {
          this->Moc.DependFilters.emplace_back(filterList[ii],
                                               filterList[ii + 1]);
        }
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !this->InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    this->GenTarget->AddIncludeDirectory(this->Dir.IncludeGenExp, true);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}